

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe31At5(uint8_t *buf)

{
  return (ulong)(((*(ushort *)(buf + 3) & 0xfff) << 0x13 | (uint)buf[2] << 0xb) + (uint)buf[1] * 8 |
                (uint)(*buf >> 5));
}

Assistant:

std::uint64_t readFlUIntLe31At5(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 3;
    res |= (buf[0] >> 5);
    res &= UINT64_C(0x7fffffff);
    return res;
}